

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_ryg_dxt.cpp
# Opt level: O2

sU32 ryg_dxt::MatchColorsBlock(Pixel *block,Pixel *color,sBool dither)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int *piVar5;
  sInt i_2;
  int iVar6;
  sInt i_3;
  int iVar7;
  uint uVar8;
  int iVar9;
  int *piVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  sInt i;
  long lVar14;
  int *piVar15;
  int iVar16;
  int local_a8 [4];
  int local_98 [8];
  sInt stops [4];
  sInt err [8];
  sInt dots [16];
  
  iVar6 = (uint)(color->field_0).r - (uint)*(byte *)((long)color + 6);
  iVar7 = (uint)(color->field_0).g - (uint)*(byte *)((long)color + 5);
  iVar13 = (uint)(color->field_0).b - (uint)color[1].field_0.b;
  for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 1) {
    stops[lVar14] =
         (uint)block[lVar14].field_0.b * iVar13 +
         (uint)*(byte *)((long)block + lVar14 * 4 + 1) * iVar7 +
         (uint)*(byte *)((long)block + lVar14 * 4 + 2) * iVar6;
  }
  for (lVar14 = 0; lVar14 != 4; lVar14 = lVar14 + 1) {
    local_a8[lVar14] =
         (uint)color[lVar14].field_0.b * iVar13 +
         (uint)*(byte *)((long)color + lVar14 * 4 + 1) * iVar7 +
         (uint)*(byte *)((long)color + lVar14 * 4 + 2) * iVar6;
  }
  iVar13 = local_a8[1] + local_a8[3] >> 1;
  iVar7 = local_a8[3] + local_a8[2] >> 1;
  iVar6 = local_a8[2] + local_a8[0] >> 1;
  if (dither) {
    iVar7 = iVar7 * 0x10;
    for (lVar14 = 0; lVar14 != 8; lVar14 = lVar14 + 1) {
      local_98[lVar14] = 0;
    }
    iVar13 = iVar13 * 0x10;
    iVar6 = iVar6 * 0x10;
    uVar12 = 0;
    piVar5 = local_98 + 4;
    piVar15 = local_98;
    for (lVar14 = 0; piVar10 = piVar5, (int)lVar14 != 0x20; lVar14 = lVar14 + 8) {
      iVar11 = *(int *)((long)stops + lVar14 * 2);
      iVar9 = *piVar10;
      iVar16 = iVar9 * 5 + iVar11 * 0x10 + piVar10[1] * 3;
      uVar8 = (uint)(iVar13 <= iVar16) * 2 + 1;
      if (iVar7 <= iVar16) {
        uVar8 = (uint)(iVar16 < iVar6) * 2;
      }
      iVar11 = iVar11 - local_a8[uVar8];
      *piVar15 = iVar11;
      iVar16 = *(int *)((long)stops + lVar14 * 2 + 4);
      iVar1 = piVar10[1];
      iVar11 = iVar16 * 0x10 + iVar9 + piVar10[2] * 3 + iVar1 * 5 + iVar11 * 7;
      uVar2 = (uint)(iVar13 <= iVar11) * 2 + 1;
      if (iVar7 <= iVar11) {
        uVar2 = (uint)(iVar11 < iVar6) * 2;
      }
      iVar16 = iVar16 - local_a8[uVar2];
      piVar15[1] = iVar16;
      iVar11 = *(int *)((long)stops + lVar14 * 2 + 8);
      iVar9 = piVar10[2];
      iVar16 = iVar11 * 0x10 + iVar1 + piVar10[3] * 3 + iVar9 * 5 + iVar16 * 7;
      uVar3 = (uint)(iVar13 <= iVar16) * 2 + 1;
      if (iVar7 <= iVar16) {
        uVar3 = (uint)(iVar16 < iVar6) * 2;
      }
      iVar11 = iVar11 - local_a8[uVar3];
      piVar15[2] = iVar11;
      iVar16 = *(int *)((long)err + lVar14 * 2 + -4);
      iVar11 = iVar16 * 0x10 + iVar9 + piVar10[3] * 5 + iVar11 * 7;
      uVar4 = (uint)(iVar13 <= iVar11) * 2 + 1;
      if (iVar7 <= iVar11) {
        uVar4 = (uint)(iVar11 < iVar6) * 2;
      }
      piVar15[3] = iVar16 - local_a8[uVar4];
      uVar12 = (uVar4 << 6 | uVar3 * 0x10 + uVar2 * 4 | uVar8) << ((byte)lVar14 & 0x1f) | uVar12;
      piVar5 = piVar15;
      piVar15 = piVar10;
    }
  }
  else {
    uVar12 = 0;
    for (uVar8 = 0xf; -1 < (int)uVar8; uVar8 = uVar8 - 1) {
      iVar11 = stops[uVar8];
      iVar9 = (iVar13 <= iVar11) + 1 + (uint)(iVar13 <= iVar11);
      if (iVar7 <= iVar11) {
        iVar9 = (uint)(iVar11 < iVar6) * 2;
      }
      uVar12 = iVar9 + uVar12 * 4;
    }
  }
  return uVar12;
}

Assistant:

static sU32 MatchColorsBlock(const Pixel* block, const Pixel* color, sBool dither) {
  sU32 mask = 0;
  sInt dirr = color[0].r - color[1].r;
  sInt dirg = color[0].g - color[1].g;
  sInt dirb = color[0].b - color[1].b;

  sInt dots[16];
  for (sInt i = 0; i < 16; i++)
    dots[i] = block[i].r * dirr + block[i].g * dirg + block[i].b * dirb;

  sInt stops[4];
  for (sInt i = 0; i < 4; i++)
    stops[i] = color[i].r * dirr + color[i].g * dirg + color[i].b * dirb;

  sInt c0Point = (stops[1] + stops[3]) >> 1;
  sInt halfPoint = (stops[3] + stops[2]) >> 1;
  sInt c3Point = (stops[2] + stops[0]) >> 1;

  if (!dither) {
    // the version without dithering is straightforward
    for (sInt i = 15; i >= 0; i--) {
      mask <<= 2;
      sInt dot = dots[i];

      if (dot < halfPoint)
        mask |= (dot < c0Point) ? 1 : 3;
      else
        mask |= (dot < c3Point) ? 2 : 0;
    }
  } else {
    // with floyd-steinberg dithering (see above)
    sInt err[8], *ep1 = err, *ep2 = err + 4;
    sInt* dp = dots;

    c0Point <<= 4;
    halfPoint <<= 4;
    c3Point <<= 4;
    for (sInt i = 0; i < 8; i++)
      err[i] = 0;

    for (sInt y = 0; y < 4; y++) {
      sInt dot, lmask, step;

      // pixel 0
      dot = (dp[0] << 4) + (3 * ep2[1] + 5 * ep2[0]);
      if (dot < halfPoint)
        step = (dot < c0Point) ? 1 : 3;
      else
        step = (dot < c3Point) ? 2 : 0;

      ep1[0] = dp[0] - stops[step];
      lmask = step;

      // pixel 1
      dot = (dp[1] << 4) + (7 * ep1[0] + 3 * ep2[2] + 5 * ep2[1] + ep2[0]);
      if (dot < halfPoint)
        step = (dot < c0Point) ? 1 : 3;
      else
        step = (dot < c3Point) ? 2 : 0;

      ep1[1] = dp[1] - stops[step];
      lmask |= step << 2;

      // pixel 2
      dot = (dp[2] << 4) + (7 * ep1[1] + 3 * ep2[3] + 5 * ep2[2] + ep2[1]);
      if (dot < halfPoint)
        step = (dot < c0Point) ? 1 : 3;
      else
        step = (dot < c3Point) ? 2 : 0;

      ep1[2] = dp[2] - stops[step];
      lmask |= step << 4;

      // pixel 3
      dot = (dp[3] << 4) + (7 * ep1[2] + 5 * ep2[3] + ep2[2]);
      if (dot < halfPoint)
        step = (dot < c0Point) ? 1 : 3;
      else
        step = (dot < c3Point) ? 2 : 0;

      ep1[3] = dp[3] - stops[step];
      lmask |= step << 6;

      // advance to next line
      sSwap(ep1, ep2);
      dp += 4;
      mask |= lmask << (y * 8);
    }
  }

  return mask;
}